

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat3x4.c
# Opt level: O0

void glmc_mat3x4_make(float *src,vec4 *dest)

{
  vec4 *dest_local;
  float *src_local;
  
  (*dest)[0] = *src;
  (*dest)[1] = src[1];
  (*dest)[2] = src[2];
  (*dest)[3] = src[3];
  dest[1][0] = src[4];
  dest[1][1] = src[5];
  dest[1][2] = src[6];
  dest[1][3] = src[7];
  dest[2][0] = src[8];
  dest[2][1] = src[9];
  dest[2][2] = src[10];
  dest[2][3] = src[0xb];
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_mat3x4_make(const float * __restrict src, mat3x4 dest) {
  glm_mat3x4_make(src, dest);
}